

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O1

void draw_quad(GLuint texture)

{
  GLFWwindow *handle;
  int height;
  int width;
  int local_20;
  int local_1c;
  
  handle = glfwGetCurrentContext();
  glfwGetFramebufferSize(handle,&local_1c,&local_20);
  glViewport(0,0,local_1c,local_20);
  glMatrixMode(0x1701);
  glLoadIdentity();
  gluOrtho2D(0,0x3ff0000000000000,0,0);
  glEnable(0xde1);
  glBindTexture(0xde1,texture);
  glTexEnvi(0x2300,0x2200,0x2100);
  glBegin(7);
  glTexCoord2f(0,0);
  glVertex2f(0,0);
  glTexCoord2f(0x3f800000,0);
  glVertex2f(0x3f800000,0);
  glTexCoord2f(0x3f800000,0x3f800000);
  glVertex2f(0x3f800000,0x3f800000);
  glTexCoord2f(0,0x3f800000);
  glVertex2f(0,0x3f800000);
  glEnd();
  return;
}

Assistant:

static void draw_quad(GLuint texture)
{
    int width, height;
    glfwGetFramebufferSize(glfwGetCurrentContext(), &width, &height);

    glViewport(0, 0, width, height);

    glMatrixMode(GL_PROJECTION);
    glLoadIdentity();
    gluOrtho2D(0.f, 1.f, 0.f, 1.f);

    glEnable(GL_TEXTURE_2D);
    glBindTexture(GL_TEXTURE_2D, texture);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_MODULATE);

    glBegin(GL_QUADS);

    glTexCoord2f(0.f, 0.f);
    glVertex2f(0.f, 0.f);

    glTexCoord2f(1.f, 0.f);
    glVertex2f(1.f, 0.f);

    glTexCoord2f(1.f, 1.f);
    glVertex2f(1.f, 1.f);

    glTexCoord2f(0.f, 1.f);
    glVertex2f(0.f, 1.f);

    glEnd();
}